

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O0

int PackBitsDecode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  undefined1 uVar1;
  tmsize_t tVar2;
  uint8_t *s_00;
  long c;
  long lStack_48;
  int b;
  long n;
  tmsize_t cc;
  int8_t *bp;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t occ_local;
  uint8_t *op_local;
  TIFF *tif_local;
  
  tVar2 = tif->tif_rawcc;
  s_00 = tif->tif_rawcp;
  tStack_28 = occ;
  occ_local = (tmsize_t)op;
LAB_003ebba9:
  cc = (tmsize_t)s_00;
  n = tVar2;
  if (0 < n && 0 < tStack_28) {
    s_00 = (uint8_t *)(cc + 1);
    lStack_48 = (long)*(char *)cc;
    tVar2 = n + -1;
    if (lStack_48 < 0) goto code_r0x003ebbfa;
    if (tStack_28 < lStack_48 + 1) {
      TIFFWarningExtR(tif,"PackBitsDecode","Discarding %ld bytes to avoid buffer overrun",
                      (lStack_48 - tStack_28) + 1);
      lStack_48 = tStack_28 + -1;
    }
    if (lStack_48 + 1 <= tVar2) {
      c = lStack_48 + 1;
      _TIFFmemcpy((void *)occ_local,s_00,c);
      occ_local = c + occ_local;
      cc = (tmsize_t)(s_00 + c);
      n = tVar2 - c;
      goto LAB_003ebd88;
    }
    TIFFWarningExtR(tif,"PackBitsDecode","Terminating PackBitsDecode due to lack of data.");
    n = tVar2;
    cc = (tmsize_t)s_00;
  }
  goto LAB_003ebd8d;
code_r0x003ebbfa:
  if (lStack_48 != -0x80) {
    lStack_48 = 1 - lStack_48;
    if (tStack_28 < lStack_48) {
      TIFFWarningExtR(tif,"PackBitsDecode","Discarding %ld bytes to avoid buffer overrun",
                      lStack_48 - tStack_28);
      lStack_48 = tStack_28;
    }
    c = lStack_48;
    if (tVar2 == 0) {
      TIFFWarningExtR(tif,"PackBitsDecode","Terminating PackBitsDecode due to lack of data.");
      n = tVar2;
      cc = (tmsize_t)s_00;
LAB_003ebd8d:
      tif->tif_rawcp = (uint8_t *)cc;
      tif->tif_rawcc = n;
      if (tStack_28 >= 1) {
        TIFFErrorExtR(tif,"PackBitsDecode","Not enough data for scanline %u",(ulong)tif->tif_row);
      }
      tif_local._4_4_ = (uint)(tStack_28 < 1);
      return tif_local._4_4_;
    }
    cc = cc + 2;
    uVar1 = *s_00;
    n = n + -2;
    while (0 < lStack_48) {
      *(undefined1 *)occ_local = uVar1;
      lStack_48 = lStack_48 + -1;
      occ_local = occ_local + 1;
    }
LAB_003ebd88:
    tStack_28 = tStack_28 - c;
    tVar2 = n;
    s_00 = (uint8_t *)cc;
  }
  goto LAB_003ebba9;
}

Assistant:

static int PackBitsDecode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "PackBitsDecode";
    int8_t *bp;
    tmsize_t cc;
    long n;
    int b;

    (void)s;
    bp = (int8_t *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    while (cc > 0 && occ > 0)
    {
        n = (long)*bp++;
        cc--;
        if (n < 0)
        {                  /* replicate next byte -n+1 times */
            if (n == -128) /* nop */
                continue;
            n = -n + 1;
            if (occ < (tmsize_t)n)
            {
                TIFFWarningExtR(tif, module,
                                "Discarding %" TIFF_SSIZE_FORMAT
                                " bytes to avoid buffer overrun",
                                (tmsize_t)n - occ);
                n = (long)occ;
            }
            if (cc == 0)
            {
                TIFFWarningExtR(
                    tif, module,
                    "Terminating PackBitsDecode due to lack of data.");
                break;
            }
            occ -= n;
            b = *bp++;
            cc--;
            while (n-- > 0)
                *op++ = (uint8_t)b;
        }
        else
        { /* copy next n+1 bytes literally */
            if (occ < (tmsize_t)(n + 1))
            {
                TIFFWarningExtR(tif, module,
                                "Discarding %" TIFF_SSIZE_FORMAT
                                " bytes to avoid buffer overrun",
                                (tmsize_t)n - occ + 1);
                n = (long)occ - 1;
            }
            if (cc < (tmsize_t)(n + 1))
            {
                TIFFWarningExtR(
                    tif, module,
                    "Terminating PackBitsDecode due to lack of data.");
                break;
            }
            _TIFFmemcpy(op, bp, ++n);
            op += n;
            occ -= n;
            bp += n;
            cc -= n;
        }
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    if (occ > 0)
    {
        TIFFErrorExtR(tif, module, "Not enough data for scanline %" PRIu32,
                      tif->tif_row);
        return (0);
    }
    return (1);
}